

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo4.cpp
# Opt level: O1

int64_t primesum::pi_lmo4(int64_t x)

{
  ulong *puVar1;
  long *plVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  int *piVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  int128_t *piVar12;
  int128_t *piVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int64_t iVar17;
  long extraout_RDX;
  int128_t *piVar18;
  int *piVar19;
  ulong uVar20;
  long r;
  long lVar21;
  size_type __n;
  ulong uVar22;
  long lVar23;
  size_type sVar24;
  bool bVar25;
  vector<int,_std::allocator<int>_> primes;
  vector<char,_std::allocator<char>_> sieve;
  vector<long,_std::allocator<long>_> next;
  vector<int,_std::allocator<int>_> mu;
  vector<__int128,_std::allocator<__int128>_> phi;
  vector<int,_std::allocator<int>_> lpf;
  int256_t s1;
  int256_t p2;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  size_type sVar26;
  vector<int,_std::allocator<int>_> local_180;
  long local_168;
  int64_t local_160;
  BinaryIndexedTree local_158;
  vector<char,_std::allocator<char>_> local_130;
  long local_118;
  ulong local_110;
  void *local_108 [2];
  long local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  vector<__int128,_std::allocator<__int128>_> local_d8;
  size_type local_c0;
  ulong local_b8;
  ulong local_b0;
  BinaryIndexedTree *local_a8;
  int128_t *local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> local_90;
  int256_t local_78;
  int256_t local_58;
  
  if (x < 2) {
    iVar17 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffe60;
    x_00._0_8_ = in_stack_fffffffffffffe58;
    dVar6 = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    dVar7 = pow((double)x,0.3333333333333333);
    lVar14 = (long)dVar7;
    if (0 < lVar14) {
      do {
        lVar21 = 1;
        iVar10 = 2;
        do {
          lVar21 = lVar21 * lVar14;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        if (lVar21 - x / lVar14 == 0 || lVar21 < x / lVar14) goto LAB_0011ff97;
        bVar25 = 1 < lVar14;
        lVar14 = lVar14 + -1;
      } while (bVar25);
      lVar14 = 0;
    }
LAB_0011ff97:
    do {
      lVar21 = lVar14;
      lVar14 = lVar21 + 1;
      lVar23 = 1;
      iVar10 = 2;
      do {
        lVar23 = lVar23 * lVar14;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    } while (lVar23 - x / lVar14 == 0 || lVar23 < x / lVar14);
    piVar18 = (int128_t *)(long)(dVar6 * (double)lVar21);
    sVar26 = 6;
    if ((long)piVar18 < 0xd) {
      sVar26 = (size_type)*(int *)(PhiTiny::pi + (long)piVar18 * 4);
    }
    x_01._8_8_ = sVar26;
    x_01._0_8_ = in_stack_fffffffffffffe58;
    P2(&local_58,(primesum *)x,(int128_t)x_01,0,(int)piVar18);
    generate_moebius(&local_f0,(int64_t)piVar18);
    generate_lpf(&local_90,(int64_t)piVar18);
    generate_primes(&local_180,(int64_t)piVar18);
    x_02._8_8_ = sVar26;
    x_02._0_8_ = in_stack_fffffffffffffe58;
    S1(&local_78,(primesum *)x,(int128_t)x_02,0,(int64_t)piVar18,(int)sVar26);
    local_118 = x / (long)piVar18;
    uVar20 = local_118 + 1;
    dVar6 = (double)(long)uVar20;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    lVar14 = 0xb504f333;
    if ((long)dVar6 < 0xb504f333) {
      lVar14 = (long)dVar6;
    }
    lVar21 = lVar14 * 2;
    do {
      lVar16 = lVar14 * lVar14;
      lVar21 = lVar21 + -2;
      lVar23 = lVar14;
      lVar14 = lVar14 + -1;
    } while (lVar16 - uVar20 != 0 && (long)uVar20 <= lVar16);
    do {
      lVar14 = lVar23;
      lVar21 = lVar21 + 2;
      lVar23 = lVar14 + 1;
    } while (lVar21 < (long)(uVar20 - lVar14 * lVar14));
    sVar24 = 1;
    if (lVar14 + 1 != 1) {
      uVar11 = lVar14 - 1;
      lVar14 = 1;
      do {
        uVar11 = (long)uVar11 >> ((byte)lVar14 & 0x3f) | uVar11;
        bVar25 = lVar14 < 0x20;
        lVar14 = lVar14 * 2;
      } while (bVar25);
      sVar24 = uVar11 + 1;
    }
    piVar19 = local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    piVar9 = piVar19;
    uVar11 = (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar19 >> 2;
    while (piVar8 = piVar9, 0 < (long)uVar11) {
      uVar15 = uVar11 >> 1;
      uVar11 = ~uVar15 + uVar11;
      piVar9 = piVar8 + uVar15 + 1;
      if ((long)piVar18 < (long)(piVar8 + uVar15 + 1)[-1]) {
        piVar9 = piVar8;
        uVar11 = uVar15;
      }
    }
    std::vector<char,_std::allocator<char>_>::vector(&local_130,sVar24,(allocator_type *)&local_158)
    ;
    std::vector<long,std::allocator<long>>::
    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<long,std::allocator<long>> *)local_108,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_158);
    __n = (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<__int128,_std::allocator<__int128>_>::vector
              (&local_d8,__n,(value_type_conflict1 *)&local_158,
               (allocator_type *)&stack0xfffffffffffffe5f);
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.size_ = 0;
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_118 < 1) {
      uVar20 = 0;
    }
    else {
      lVar14 = (long)piVar8 - (long)piVar19 >> 2;
      lVar21 = -1;
      local_110 = 0;
      local_98 = 0;
      uVar11 = 1;
      local_168 = lVar14;
      local_160 = x;
      local_c0 = sVar24;
      local_b8 = uVar20;
      do {
        sVar24 = local_c0;
        __n = sVar26;
        if (local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memset(local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,1,
                 (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
          __n = sVar26;
        }
        local_b0 = uVar11 + sVar24;
        uVar20 = local_b0;
        if ((long)local_b8 < (long)local_b0) {
          uVar20 = local_b8;
        }
        if (0 < (long)__n) {
          sVar26 = 1;
          do {
            lVar23 = *(long *)((long)local_108[0] + sVar26 * 8);
            if (lVar23 < (long)uVar20) {
              iVar10 = local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar26];
              do {
                local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar23 + lVar21] = '\0';
                lVar23 = lVar23 + iVar10;
              } while (lVar23 < (long)uVar20);
            }
            *(long *)((long)local_108[0] + sVar26 * 8) = lVar23;
            bVar25 = sVar26 != __n;
            sVar26 = sVar26 + 1;
          } while (bVar25);
        }
        BinaryIndexedTree::init<std::vector<char,std::allocator<char>>>
                  (&local_158,&local_130,uVar11);
        local_a8 = (BinaryIndexedTree *)(~uVar11 + uVar20);
        sVar26 = __n;
        do {
          __n = __n + 1;
          if (lVar14 <= (long)__n) break;
          iVar10 = local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[__n];
          lVar16 = (long)iVar10;
          lVar23 = x / (long)(uVar20 * lVar16);
          lVar14 = (long)piVar18 / lVar16;
          if ((long)piVar18 / lVar16 < lVar23) {
            lVar14 = lVar23;
          }
          piVar12 = (int128_t *)(x / (long)(uVar11 * lVar16));
          iVar17 = x % (long)(uVar11 * lVar16);
          if ((long)piVar18 <= (long)piVar12) {
            piVar12 = piVar18;
          }
          if (lVar16 < (long)piVar12) {
            local_a0 = piVar12;
            if (lVar14 < (long)piVar12) {
              lVar23 = (long)piVar12 * lVar16;
              do {
                if ((local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar12] != 0) &&
                   (iVar10 < local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)piVar12])) {
                  piVar13 = BinaryIndexedTree::sum
                                      ((int128_t *)&local_158,
                                       (BinaryIndexedTree *)(local_160 / lVar23 - uVar11),
                                       local_160 % lVar23);
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = (long)piVar13 +
                                 *(ulong *)(local_d8.
                                            super__Vector_base<__int128,_std::allocator<__int128>_>.
                                            _M_impl.super__Vector_impl_data._M_start + __n);
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[(long)piVar12] * lVar23;
                  uVar15 = SUB168(auVar4 * auVar5,0);
                  iVar17 = SUB168(auVar4 * auVar5,8) +
                           (*(long *)((long)local_d8.
                                            super__Vector_base<__int128,_std::allocator<__int128>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     __n * 0x10 + 8) +
                           (ulong)CARRY8((ulong)piVar13,
                                         *(ulong *)(local_d8.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + __n)))
                           * local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)piVar12] * lVar23;
                  bVar25 = local_110 < uVar15;
                  local_110 = local_110 - uVar15;
                  local_98 = (local_98 - iVar17) - (ulong)bVar25;
                }
                piVar12 = (int128_t *)((long)piVar12 + -1);
                lVar23 = lVar23 - lVar16;
              } while (lVar14 < (long)piVar12);
            }
            piVar12 = BinaryIndexedTree::sum((int128_t *)&local_158,local_a8,iVar17);
            puVar1 = (ulong *)(local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>.
                               _M_impl.super__Vector_impl_data._M_start + __n);
            uVar15 = *puVar1;
            *puVar1 = *puVar1 + (long)piVar12;
            plVar2 = (long *)((long)local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>
                                    ._M_impl.super__Vector_impl_data._M_start + __n * 0x10 + 8);
            *plVar2 = *plVar2 + extraout_RDX + (ulong)CARRY8(uVar15,(ulong)piVar12);
            uVar15 = *(ulong *)((long)local_108[0] + __n * 8);
            if ((long)uVar15 < (long)uVar20) {
              do {
                lVar14 = uVar15 - uVar11;
                if (local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14] != '\0') {
                  local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar14] = '\0';
                  uVar22 = lVar14 >> 1;
                  do {
                    puVar1 = (ulong *)(local_158.tree_.
                                       super__Vector_base<__int128,_std::allocator<__int128>_>.
                                       _M_impl.super__Vector_impl_data._M_start + uVar22);
                    uVar3 = *puVar1;
                    *puVar1 = *puVar1 - uVar15;
                    plVar2 = (long *)((long)local_158.tree_.
                                            super__Vector_base<__int128,_std::allocator<__int128>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     uVar22 * 0x10 + 8);
                    *plVar2 = (*plVar2 - ((long)uVar15 >> 0x3f)) - (ulong)(uVar3 < uVar15);
                    uVar22 = uVar22 | uVar22 + 1;
                  } while ((long)uVar22 < local_158.size_);
                }
                uVar15 = uVar15 + lVar16 * 2;
              } while ((long)uVar15 < (long)uVar20);
            }
            *(ulong *)((long)local_108[0] + __n * 8) = uVar15;
            piVar12 = local_a0;
            x = local_160;
          }
          lVar14 = local_168;
        } while (lVar16 < (long)piVar12);
        lVar21 = lVar21 - local_c0;
        uVar11 = local_b0;
        uVar20 = local_110;
      } while ((long)local_b0 <= local_118);
    }
    if (local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      __n = (long)local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                  super__Vector_impl_data._M_start;
      operator_delete(local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>.
                      _M_impl.super__Vector_impl_data._M_start,__n);
    }
    if (local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      __n = (long)local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                  super__Vector_impl_data._M_start;
      operator_delete(local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                      super__Vector_impl_data._M_start,__n);
    }
    if (local_108[0] != (void *)0x0) {
      __n = local_f8 - (long)local_108[0];
      operator_delete(local_108[0],__n);
    }
    if (local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      __n = (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      operator_delete(local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,__n);
    }
    piVar18 = prime_sum_tiny(piVar18,__n);
    if (local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar17 = (long)piVar18 + ~(ulong)local_58.low + (long)local_78.low + uVar20;
  }
  return iVar17;
}

Assistant:

int64_t pi_lmo4(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}